

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processingInitial(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  switch(c) {
  case '\0':
    break;
  default:
    bVar1 = IsSpace(c);
    if (bVar1) {
      setLineAndPositionOfToken(this);
      this->state = S_Blank;
    }
    else if (c == '-') {
      error(this,E_UnexpectedCharacter,'-');
    }
    else {
      bVar1 = IsWordLetter(c);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)
                   &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                    super_CQualifierParser.token.word,c);
        setLineAndPositionOfToken(this);
        this->state = S_Word;
      }
      else {
        error(this,E_InvalidCharacter,c);
      }
    }
    break;
  case '\n':
    addTokenWithCurrentLineAndPosition(this,TT_LineFeed);
    break;
  case '(':
    addTokenWithCurrentLineAndPosition(this,TT_LeftParen);
    break;
  case ')':
    addTokenWithCurrentLineAndPosition(this,TT_RightParen);
    break;
  case ',':
    addTokenWithCurrentLineAndPosition(this,TT_Comma);
    break;
  case '.':
  case '>':
    std::__cxx11::string::operator=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,c);
    addTokenWithCurrentLineAndPosition(this,TT_RightBracket);
    break;
  case '/':
    setLineAndPositionOfToken(this);
    this->state = S_Symbol;
    break;
  case ':':
    setLineAndPositionOfToken(this);
    this->state = S_BeginOfQualifier;
    break;
  case '<':
    addTokenWithCurrentLineAndPosition(this,TT_LeftBracket);
    break;
  case '=':
    addTokenWithCurrentLineAndPosition(this,TT_Equal);
  }
  return;
}

Assistant:

void CScanner::processingInitial( char c )
{
	switch( c ) {
		case Comma:
			addTokenWithCurrentLineAndPosition( TT_Comma );
			break;
		case Equal:
			addTokenWithCurrentLineAndPosition( TT_Equal );
			break;
		case LineFeed:
			addTokenWithCurrentLineAndPosition( TT_LineFeed );
			break;
		case LeftParen:
			addTokenWithCurrentLineAndPosition( TT_LeftParen );
			break;
		case RightParen:
			addTokenWithCurrentLineAndPosition( TT_RightParen );
			break;
		case LeftBracket:
			addTokenWithCurrentLineAndPosition( TT_LeftBracket );
			break;
		case Dot:
		case RightBracket:
			token.word = c;
			addTokenWithCurrentLineAndPosition( TT_RightBracket );
			break;
		case LimiterOfSymbol:
			setLineAndPositionOfToken();
			state = S_Symbol;
			break;
		case LimiterOfQualifier:
			setLineAndPositionOfToken();
			state = S_BeginOfQualifier;
			break;
		case UniversalSeparatorOfTokens:
			break;
		default:
			if( IsSpace( c ) ) {
				setLineAndPositionOfToken();
				state = S_Blank;
			} else if( c == Hyphen ) {
				error( E_UnexpectedCharacter, c );
			} else if( IsWordLetter( c ) ) {
				token.word = c;
				setLineAndPositionOfToken();
				state = S_Word;
			} else {
				error( E_InvalidCharacter, c );
			}
			break;
	}
}